

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_cylinder_wires
               (rf_vec3 position,float radius_top,float radius_bottom,float height,int sides,
               rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float __x;
  float local_38;
  float fStack_34;
  
  uVar4 = 3;
  if (3 < sides) {
    uVar4 = sides;
  }
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= (int)(uVar4 * 8 + prVar3[lVar2].v_counter)) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_38 = position.x;
  fStack_34 = position.y;
  rf_gfx_translatef(local_38,fStack_34,position.z);
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  uVar5 = 0;
  do {
    __x = (float)(long)uVar5 * 0.017453292;
    fVar6 = sinf(__x);
    fVar7 = cosf(__x);
    rf_gfx_vertex3f(fVar6 * radius_bottom,0.0,fVar7 * radius_bottom);
    fVar6 = (float)(long)(0x168 / (ulong)uVar4 + uVar5) * 0.017453292;
    fVar7 = sinf(fVar6);
    fVar8 = cosf(fVar6);
    rf_gfx_vertex3f(fVar7 * radius_bottom,0.0,fVar8 * radius_bottom);
    fVar7 = sinf(fVar6);
    fVar8 = cosf(fVar6);
    rf_gfx_vertex3f(fVar7 * radius_bottom,0.0,fVar8 * radius_bottom);
    fVar7 = sinf(fVar6);
    fVar8 = cosf(fVar6);
    rf_gfx_vertex3f(fVar7 * radius_top,height,fVar8 * radius_top);
    fVar7 = sinf(fVar6);
    fVar6 = cosf(fVar6);
    rf_gfx_vertex3f(fVar7 * radius_top,height,fVar6 * radius_top);
    fVar6 = sinf(__x);
    fVar7 = cosf(__x);
    rf_gfx_vertex3f(fVar6 * radius_top,height,fVar7 * radius_top);
    fVar6 = sinf(__x);
    fVar7 = cosf(__x);
    rf_gfx_vertex3f(fVar6 * radius_top,height,fVar7 * radius_top);
    fVar6 = sinf(__x);
    fVar7 = cosf(__x);
    rf_gfx_vertex3f(fVar6 * radius_bottom,0.0,fVar7 * radius_bottom);
    uVar5 = uVar5 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / ZEXT416(uVar4),0);
  } while (uVar5 < 0x168);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cylinder_wires(rf_vec3 position, float radius_top, float radius_bottom, float height, int sides, rf_color color)
{
    if (sides < 3) sides = 3;

    int num_vertex = sides*8;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    for (rf_int i = 0; i < 360; i += 360/sides)
    {
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
    }
    rf_gfx_end();
    rf_gfx_pop_matrix();
}